

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::predictMotion(btSoftBody *this,btScalar dt)

{
  uint uVar1;
  Node *pNVar2;
  btDbvtNode *leaf;
  Face *pFVar3;
  undefined8 uVar4;
  float fVar5;
  int c;
  long lVar6;
  ulong uVar7;
  btVector3 *v;
  ulong uVar8;
  int i;
  long lVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float fVar11;
  float fVar12;
  btVector3 bVar13;
  float local_118;
  float fStack_114;
  float local_f8;
  btDbvtVolume vol;
  btVector3 local_c8;
  btVector3 x;
  btVector3 deltaV;
  
  if (this->m_bUpdateRtCst == true) {
    this->m_bUpdateRtCst = false;
    updateConstants(this);
    btDbvt::clear(&this->m_fdbvt);
    if (((this->m_cfg).collisions & 0x10) != 0) {
      initializeFaceTree(this);
    }
  }
  fVar10 = dt * (this->m_cfg).timescale;
  (this->m_sst).sdt = fVar10;
  (this->m_sst).isdt = 1.0 / fVar10;
  (this->m_sst).velmrg = fVar10 * 3.0;
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  (this->m_sst).radmrg = extraout_XMM0_Da;
  (this->m_sst).updmrg = extraout_XMM0_Da * 0.25;
  deltaV = operator*(&this->m_worldInfo->m_gravity,&(this->m_sst).sdt);
  addVelocity(this,&deltaV);
  applyForces(this);
  uVar1 = (this->m_nodes).m_size;
  uVar8 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    pNVar2 = (this->m_nodes).m_data;
    uVar4 = *(undefined8 *)(pNVar2[uVar8].m_x.m_floats + 2);
    *(undefined8 *)pNVar2[uVar8].m_q.m_floats = *(undefined8 *)pNVar2[uVar8].m_x.m_floats;
    *(undefined8 *)(pNVar2[uVar8].m_q.m_floats + 2) = uVar4;
    v = &pNVar2[uVar8].m_f;
    bVar13 = operator*(v,&pNVar2[uVar8].m_im);
    fVar10 = (this->m_sst).sdt;
    deltaV.m_floats[0] = fVar10 * bVar13.m_floats[0];
    deltaV.m_floats[1] = fVar10 * bVar13.m_floats[1];
    deltaV.m_floats[2] = bVar13.m_floats[2] * fVar10;
    deltaV.m_floats[3] = 0.0;
    fVar10 = this->m_worldInfo->m_maxDisplacement / fVar10;
    fVar11 = -fVar10;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      fVar12 = deltaV.m_floats[lVar6];
      fVar5 = fVar10;
      if ((fVar10 < fVar12) || (fVar5 = fVar12, fVar12 < fVar11)) {
        fVar12 = fVar11;
        if (fVar11 <= fVar5) {
          fVar12 = fVar5;
        }
        deltaV.m_floats[lVar6] = fVar12;
      }
    }
    btVector3::operator+=(&pNVar2[uVar8].m_v,&deltaV);
    vol.mi = operator*(&pNVar2[uVar8].m_v,&(this->m_sst).sdt);
    btVector3::operator+=(&pNVar2[uVar8].m_x,&vol.mi);
    v->m_floats[0] = 0.0;
    v->m_floats[1] = 0.0;
    pNVar2[uVar8].m_f.m_floats[2] = 0.0;
    pNVar2[uVar8].m_f.m_floats[3] = 0.0;
  }
  updateClusters(this);
  updateBounds(this);
  uVar1 = (this->m_nodes).m_size;
  uVar8 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 * 0x78 - uVar8 != 0; uVar8 = uVar8 + 0x78) {
    pNVar2 = (this->m_nodes).m_data;
    btDbvtAabbMm::FromCR
              ((btDbvtAabbMm *)&deltaV,(btVector3 *)((long)(pNVar2->m_x).m_floats + uVar8),
               (this->m_sst).radmrg);
    vol.mi = deltaV;
    leaf = *(btDbvtNode **)((long)(&pNVar2->m_n + 1) + uVar8 + 8);
    deltaV = operator*((btVector3 *)((long)(pNVar2->m_v).m_floats + uVar8),&(this->m_sst).velmrg);
    btDbvt::update(&this->m_ndbvt,leaf,&vol,&deltaV,(this->m_sst).updmrg);
  }
  if ((this->m_fdbvt).m_root != (btDbvtNode *)0x0) {
    lVar6 = 0;
    for (lVar9 = 0; lVar9 < (this->m_faces).m_size; lVar9 = lVar9 + 1) {
      pFVar3 = (this->m_faces).m_data;
      x = operator+((btVector3 *)(*(long *)((long)pFVar3->m_n + lVar6) + 0x30),
                    (btVector3 *)(*(long *)((long)pFVar3->m_n + lVar6 + 8) + 0x30));
      deltaV = operator+(&x,(btVector3 *)(*(long *)((long)pFVar3->m_n + lVar6 + 0x10) + 0x30));
      local_c8.m_floats[0] = 3.0;
      bVar13 = operator/(&deltaV,local_c8.m_floats);
      VolumeOf((btDbvtVolume *)&deltaV,(Face *)((long)pFVar3->m_n + lVar6 + -0x10),
               (this->m_sst).radmrg);
      vol.mi = deltaV;
      fVar10 = (this->m_sst).velmrg;
      local_f8 = bVar13.m_floats[2];
      local_118 = bVar13.m_floats[0];
      fStack_114 = bVar13.m_floats[1];
      deltaV.m_floats[1] = fVar10 * fStack_114;
      deltaV.m_floats[0] = fVar10 * local_118;
      deltaV.m_floats[2] = local_f8 * fVar10;
      deltaV.m_floats[3] = 0.0;
      btDbvt::update(&this->m_fdbvt,*(btDbvtNode **)((long)(&pFVar3->m_normal + 1) + lVar6 + 8),&vol
                     ,&deltaV,(this->m_sst).updmrg);
      lVar6 = lVar6 + 0x48;
    }
  }
  updatePose(this);
  if (((this->m_pose).m_bframe == true) && (0.0 < (this->m_cfg).kMT)) {
    deltaV.m_floats = *&(this->m_pose).m_rot.m_el[0].m_floats;
    uVar1 = (this->m_nodes).m_size;
    uVar8 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar8;
    }
    lVar6 = 0x10;
    for (; uVar7 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
      pNVar2 = (this->m_nodes).m_data;
      if (0.0 < *(float *)((long)(pNVar2->m_n).m_floats + lVar6)) {
        local_c8 = operator*((btMatrix3x3 *)&deltaV,
                             (btVector3 *)((long)((this->m_pose).m_pos.m_data)->m_floats + uVar8));
        x = operator+(&local_c8,&(this->m_pose).m_com);
        bVar13 = Lerp<btVector3>((btVector3 *)
                                 ((long)&(((Node *)(&pNVar2->m_x + -1))->super_Feature).
                                         super_Element.m_tag + lVar6),&x,(this->m_cfg).kMT);
        *(btScalar (*) [4])
         ((long)&(((Node *)(&pNVar2->m_x + -1))->super_Feature).super_Element.m_tag + lVar6) =
             bVar13.m_floats;
      }
      lVar6 = lVar6 + 0x78;
    }
  }
  deltaV.m_floats = (btScalar  [4])ZEXT816(0);
  btAlignedObjectArray<btSoftBody::RContact>::resize(&this->m_rcontacts,0,(RContact *)&deltaV);
  deltaV.m_floats = (btScalar  [4])ZEXT816(0);
  btAlignedObjectArray<btSoftBody::SContact>::resize(&this->m_scontacts,0,(SContact *)&deltaV);
  btDbvt::optimizeIncremental(&this->m_ndbvt,1);
  btDbvt::optimizeIncremental(&this->m_fdbvt,1);
  btDbvt::optimizeIncremental(&this->m_cdbvt,1);
  return;
}

Assistant:

void			btSoftBody::predictMotion(btScalar dt)
{

	int i,ni;

	/* Update				*/ 
	if(m_bUpdateRtCst)
	{
		m_bUpdateRtCst=false;
		updateConstants();
		m_fdbvt.clear();
		if(m_cfg.collisions&fCollision::VF_SS)
		{
			initializeFaceTree();			
		}
	}

	/* Prepare				*/ 
	m_sst.sdt		=	dt*m_cfg.timescale;
	m_sst.isdt		=	1/m_sst.sdt;
	m_sst.velmrg	=	m_sst.sdt*3;
	m_sst.radmrg	=	getCollisionShape()->getMargin();
	m_sst.updmrg	=	m_sst.radmrg*(btScalar)0.25;
	/* Forces				*/ 
	addVelocity(m_worldInfo->m_gravity*m_sst.sdt);
	applyForces();
	/* Integrate			*/ 
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_q	=	n.m_x;
		btVector3 deltaV = n.m_f*n.m_im*m_sst.sdt;
		{
			btScalar maxDisplacement = m_worldInfo->m_maxDisplacement;
			btScalar clampDeltaV = maxDisplacement/m_sst.sdt;
			for (int c=0;c<3;c++)
			{
				if (deltaV[c]>clampDeltaV)
				{
					deltaV[c] = clampDeltaV;
				}
				if (deltaV[c]<-clampDeltaV)
				{
					deltaV[c]=-clampDeltaV;
				}
			}
		}
		n.m_v	+=	deltaV;
		n.m_x	+=	n.m_v*m_sst.sdt;
		n.m_f	=	btVector3(0,0,0);
	}
	/* Clusters				*/ 
	updateClusters();
	/* Bounds				*/ 
	updateBounds();	
	/* Nodes				*/ 
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		vol = btDbvtVolume::FromCR(n.m_x,m_sst.radmrg);
		m_ndbvt.update(	n.m_leaf,
			vol,
			n.m_v*m_sst.velmrg,
			m_sst.updmrg);
	}
	/* Faces				*/ 
	if(!m_fdbvt.empty())
	{
		for(int i=0;i<m_faces.size();++i)
		{
			Face&			f=m_faces[i];
			const btVector3	v=(	f.m_n[0]->m_v+
				f.m_n[1]->m_v+
				f.m_n[2]->m_v)/3;
			vol = VolumeOf(f,m_sst.radmrg);
			m_fdbvt.update(	f.m_leaf,
				vol,
				v*m_sst.velmrg,
				m_sst.updmrg);
		}
	}
	/* Pose					*/ 
	updatePose();
	/* Match				*/ 
	if(m_pose.m_bframe&&(m_cfg.kMT>0))
	{
		const btMatrix3x3	posetrs=m_pose.m_rot;
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			if(n.m_im>0)
			{
				const btVector3	x=posetrs*m_pose.m_pos[i]+m_pose.m_com;
				n.m_x=Lerp(n.m_x,x,m_cfg.kMT);
			}
		}
	}
	/* Clear contacts		*/ 
	m_rcontacts.resize(0);
	m_scontacts.resize(0);
	/* Optimize dbvt's		*/ 
	m_ndbvt.optimizeIncremental(1);
	m_fdbvt.optimizeIncremental(1);
	m_cdbvt.optimizeIncremental(1);
}